

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_ldi_df_mips64(CPUMIPSState_conflict5 *env,uint32_t df,uint32_t wd,int32_t s10)

{
  fpr_t *pfVar1;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 auVar2 [16];
  
  if (3 < df) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                  ,0x118b,
                  "void helper_msa_ldi_df_mips64(CPUMIPSState *, uint32_t, uint32_t, int32_t)");
  }
  pfVar1 = (env->active_fpu).fpr + wd;
  switch(df) {
  case 0:
    uVar5 = (undefined1)((uint)s10 >> 0x18);
    uVar4 = (undefined1)((uint)s10 >> 0x10);
    uVar3 = (undefined1)((uint)s10 >> 8);
    auVar2._4_4_ = (int)(CONCAT35(CONCAT21(CONCAT11(uVar5,uVar5),uVar4),CONCAT14(uVar4,s10)) >> 0x20
                        );
    auVar2[3] = uVar3;
    auVar2[2] = uVar3;
    auVar2[0] = (undefined1)s10;
    auVar2[1] = auVar2[0];
    auVar2._8_8_ = 0;
    break;
  case 1:
    auVar2 = ZEXT416((uint)s10);
    break;
  case 2:
    goto LAB_008afd6f;
  case 3:
    pfVar1->fd = (long)s10;
    *(long *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = (long)s10;
    return;
  }
  auVar2 = pshuflw(auVar2,auVar2,0);
  s10 = auVar2._0_4_;
LAB_008afd6f:
  pfVar1->fs[0] = s10;
  *(int32_t *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 4) = s10;
  *(int32_t *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = s10;
  *(int32_t *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xc) = s10;
  return;
}

Assistant:

void helper_msa_ldi_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                       int32_t s10)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    uint32_t i;

    switch (df) {
    case DF_BYTE:
        for (i = 0; i < DF_ELEMENTS(DF_BYTE); i++) {
            pwd->b[i] = (int8_t)s10;
        }
        break;
    case DF_HALF:
        for (i = 0; i < DF_ELEMENTS(DF_HALF); i++) {
            pwd->h[i] = (int16_t)s10;
        }
        break;
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            pwd->w[i] = (int32_t)s10;
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            pwd->d[i] = (int64_t)s10;
        }
       break;
    default:
        assert(0);
    }
}